

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O2

void Frc_ManPlaceDfs(Frc_Man_t *p,Vec_Int_t *vCoOrder)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int local_34;
  
  iVar6 = p->nObjData;
  iVar7 = 0;
  iVar5 = 0;
  while ((iVar5 < iVar6 && (piVar4 = p->pObjData, piVar4 != (int *)0x0))) {
    uVar2 = piVar4[iVar5];
    iVar3 = piVar4[(long)iVar5 + 1];
    piVar4[(long)iVar5 + 2] = iVar3;
    if ((uVar2 & 2) == 0 && iVar3 == 0) {
      piVar4[(long)iVar5 + 4] = iVar7;
      iVar7 = iVar7 + 1;
    }
    iVar5 = iVar5 + iVar3 + (uVar2 >> 4) + 6;
  }
  for (iVar6 = 0; local_34 = iVar7, iVar6 < vCoOrder->nSize; iVar6 = iVar6 + 1) {
    iVar5 = Vec_IntEntry(vCoOrder,iVar6);
    if (p->pObjData == (int *)0x0) break;
    pbVar1 = (byte *)(p->pObjData + iVar5);
    if ((*pbVar1 & 2) == 0) {
      __assert_fail("Frc_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                    ,0x343,"void Frc_ManPlaceDfs(Frc_Man_t *, Vec_Int_t *)");
    }
    Frc_ManPlaceDfs_rec(p,(Frc_Obj_t *)(pbVar1 + (long)*(int *)(pbVar1 + 0x18) * -4),&local_34);
    iVar7 = local_34 + 1;
    *(int *)(pbVar1 + 0x10) = local_34;
  }
  if (iVar7 == p->nObjs) {
    return;
  }
  __assert_fail("nPlaces == p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                ,0x347,"void Frc_ManPlaceDfs(Frc_Man_t *, Vec_Int_t *)");
}

Assistant:

void Frc_ManPlaceDfs( Frc_Man_t * p, Vec_Int_t * vCoOrder )
{
    Frc_Obj_t * pObj;
    int i, nPlaces = 0;
    Frc_ManForEachObj( p, pObj, i )
    {
        pObj->iFanout = pObj->nFanouts;
        if ( pObj->nFanouts == 0 && !Frc_ObjIsCo(pObj) )
            pObj->pPlace = nPlaces++;
    }
    Frc_ManForEachObjVec( vCoOrder, p, pObj, i )
    {
        assert( Frc_ObjIsCo(pObj) );
        Frc_ManPlaceDfs_rec( p, Frc_ObjFanin(pObj,0), &nPlaces );
        pObj->pPlace = nPlaces++;
    }
    assert( nPlaces == p->nObjs );
}